

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError CommitDeviceInfos(PaUtilHostApiRepresentation *hostApi,PaHostApiIndex index,
                         void *scanResults,int deviceCount)

{
  PaLinuxScanDeviceInfosResults *scanDeviceInfosResults;
  PaError result;
  PaAlsaHostApiRepresentation *alsaHostApi;
  int deviceCount_local;
  void *scanResults_local;
  PaHostApiIndex index_local;
  PaUtilHostApiRepresentation *hostApi_local;
  
  (hostApi->info).defaultInputDevice = -1;
  (hostApi->info).defaultOutputDevice = -1;
  if (hostApi->deviceInfos != (PaDeviceInfo **)0x0) {
    FreeDeviceInfos((PaUtilAllocationGroup *)hostApi[3].privatePaFrontInfo.baseDeviceIndex,
                    hostApi->deviceInfos,(hostApi->info).deviceCount);
    hostApi->deviceInfos = (PaDeviceInfo **)0x0;
  }
  if (scanResults != (void *)0x0) {
    if (0 < deviceCount) {
      hostApi->deviceInfos = *scanResults;
      (hostApi->info).defaultInputDevice = *(PaDeviceIndex *)((long)scanResults + 8);
      (hostApi->info).defaultOutputDevice = *(PaDeviceIndex *)((long)scanResults + 0xc);
      (hostApi->info).deviceCount = deviceCount;
    }
    PaUtil_GroupFreeMemory
              ((PaUtilAllocationGroup *)hostApi[3].privatePaFrontInfo.baseDeviceIndex,scanResults);
  }
  return 0;
}

Assistant:

static PaError CommitDeviceInfos(struct PaUtilHostApiRepresentation *hostApi, PaHostApiIndex index,
                                 void *scanResults, int deviceCount)
{
    PaAlsaHostApiRepresentation* alsaHostApi = (PaAlsaHostApiRepresentation*)hostApi;
    PaError result = paNoError;

    /* These two will be set to the first working input and output device, respectively */
    hostApi->info.defaultInputDevice = paNoDevice;
    hostApi->info.defaultOutputDevice = paNoDevice;

    /* Free any old memory which might be in the device info */
    if( hostApi->deviceInfos )
    {
        /* all device info structs are allocated in a block so we can destroy them here */
        FreeDeviceInfos( alsaHostApi->allocations, hostApi->deviceInfos, hostApi->info.deviceCount );
        hostApi->deviceInfos = NULL;
    }

    if( scanResults != NULL )
    {
        PaLinuxScanDeviceInfosResults *scanDeviceInfosResults = ( PaLinuxScanDeviceInfosResults * ) scanResults;

        if( deviceCount > 0 )
        {
            /* use the array allocated in ScanDeviceInfos() as our deviceInfos */
            hostApi->deviceInfos = scanDeviceInfosResults->deviceInfos;
            hostApi->info.defaultInputDevice = scanDeviceInfosResults->defaultInputDevice;
            hostApi->info.defaultOutputDevice = scanDeviceInfosResults->defaultOutputDevice;
            hostApi->info.deviceCount = deviceCount;
        }

        PaUtil_GroupFreeMemory( alsaHostApi->allocations, scanDeviceInfosResults );
    }

    return result;
}